

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
emplace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
          (QHash<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  uint *puVar1;
  Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  SynthesizedMouseData local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(uint **)this;
  if (puVar1 == (uint *)0x0) {
LAB_002e1cee:
    pDVar2 = *(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> **
              )this;
    local_58.pos.xp = (qreal)puVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
               detached(pDVar2);
      *(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> **)this =
           pDVar2;
    }
    pVar3 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                             (this,key,args);
    QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
              ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)&local_58);
  }
  else {
    if (1 < *puVar1) {
      if ((puVar1 != (uint *)0x0) && (*puVar1 != 0xffffffff)) {
        LOCK();
        *puVar1 = *puVar1 + 1;
        UNLOCK();
      }
      goto LAB_002e1cee;
    }
    if (*(ulong *)(puVar1 + 2) < *(ulong *)(puVar1 + 4) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData_const&>
                                 (this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_002e1da6;
    }
    local_58.pos.xp = (args->pos).xp;
    local_58.pos.yp = (args->pos).yp;
    local_58.screenPos.xp = (args->screenPos).xp;
    local_58.screenPos.yp = (args->screenPos).yp;
    local_58.window.wp.d = (args->window).wp.d;
    local_58.window.wp.value = (args->window).wp.value;
    if (local_58.window.wp.d != (Data *)0x0) {
      LOCK();
      ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
                   emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>
                             ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)this
                              ,key,&local_58);
    if (local_58.window.wp.d != (Data *)0x0) {
      LOCK();
      ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_58.window.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_58.window.wp.d != (Data *)0x0)) {
        operator_delete(local_58.window.wp.d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_002e1da6:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }